

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionAlgorithmsBullet.cpp
# Opt level: O3

void __thiscall
chrono::collision::cbtCylshellBoxCollisionAlgorithm::processCollision
          (cbtCylshellBoxCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0,
          cbtCollisionObjectWrapper *body1,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  float fVar1;
  cbtTransform *pcVar2;
  cbtCollisionShape *pcVar3;
  cbtCollisionShape *pcVar4;
  cbtPersistentManifold *this_00;
  cbtCollisionObject *pcVar5;
  cbtCollisionObject *pcVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  cbtVector3 cVar11;
  cbtManifoldResult *pcVar12;
  undefined1 auVar13 [8];
  bool bVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  cbtCollisionObjectWrapper *pcVar20;
  cbtCollisionObject *pcVar21;
  ulong uVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  float fVar25;
  cbtScalar cVar26;
  undefined8 uVar27;
  undefined8 uVar31;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  cbtScalar tMin;
  cbtScalar tMax;
  cbtVector3 cs;
  cbtVector3 a;
  cbtVector3 pMid;
  cbtVector3 pMax;
  cbtVector3 pMin;
  cbtVector3 hdims;
  float local_14c;
  undefined8 local_148;
  float local_13c;
  cbtVector3 local_138;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  cbtVector3 local_108;
  cbtVector3 local_f8;
  ulong local_e8;
  cbtManifoldResult *local_e0;
  float local_d8;
  undefined4 uStack_d4;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  cbtCylshellBoxCollisionAlgorithm *local_b8;
  cbtTransform *local_b0;
  cbtVector3 local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  ulong local_78;
  cbtVector3 local_70;
  cbtVector3 local_60;
  cbtVector3 local_50;
  cbtVector3 local_40;
  
  if (this->m_manifoldPtr != (cbtPersistentManifold *)0x0) {
    bVar14 = this->m_isSwapped;
    resultOut->m_manifoldPtr = this->m_manifoldPtr;
    pcVar20 = body1;
    if (bVar14 != false) {
      pcVar20 = body0;
      body0 = body1;
    }
    pcVar2 = body0->m_worldTransform;
    pcVar3 = body0->m_shape;
    local_b0 = pcVar20->m_worldTransform;
    pcVar4 = pcVar20->m_shape;
    fVar25 = (pcVar2->m_basis).m_el[1].m_floats[1];
    fVar1 = (local_b0->m_basis).m_el[1].m_floats[2];
    uVar27 = *(undefined8 *)(local_b0->m_basis).m_el[1].m_floats;
    cVar26 = (pcVar2->m_basis).m_el[0].m_floats[1];
    auVar42._4_4_ = cVar26;
    auVar42._0_4_ = cVar26;
    auVar42._8_4_ = cVar26;
    auVar42._12_4_ = cVar26;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = *(ulong *)(local_b0->m_basis).m_el[0].m_floats;
    cVar26 = (pcVar2->m_basis).m_el[2].m_floats[1];
    auVar48._4_4_ = cVar26;
    auVar48._0_4_ = cVar26;
    auVar48._8_4_ = cVar26;
    auVar48._12_4_ = cVar26;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = *(ulong *)(local_b0->m_basis).m_el[2].m_floats;
    fVar7 = (pcVar2->m_origin).m_floats[1] - (local_b0->m_origin).m_floats[1];
    fVar8 = (pcVar2->m_origin).m_floats[0] - (local_b0->m_origin).m_floats[0];
    fVar34 = (pcVar2->m_origin).m_floats[2] - (local_b0->m_origin).m_floats[2];
    fVar50 = (float)uVar27;
    auVar41._0_4_ = fVar50 * fVar25;
    fVar51 = (float)((ulong)uVar27 >> 0x20);
    auVar41._4_4_ = fVar51 * fVar25;
    auVar41._8_4_ = fVar25 * 0.0;
    auVar41._12_4_ = fVar25 * 0.0;
    auVar38 = ZEXT416((uint)(local_b0->m_basis).m_el[0].m_floats[2]);
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * fVar1)),auVar38,auVar42);
    auVar9 = vfmadd231ps_fma(auVar41,auVar52,auVar42);
    auVar43._0_4_ = fVar50 * fVar7;
    auVar43._4_4_ = fVar51 * fVar7;
    auVar43._8_4_ = fVar7 * 0.0;
    auVar43._12_4_ = fVar7 * 0.0;
    auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar1)),auVar38,ZEXT416((uint)fVar8));
    auVar41 = ZEXT416((uint)(local_b0->m_basis).m_el[2].m_floats[2]);
    auVar24 = vfmadd231ss_fma(auVar10,auVar41,auVar48);
    auVar10 = vfmadd231ps_fma(auVar9,auVar53,auVar48);
    auVar49._4_4_ = fVar8;
    auVar49._0_4_ = fVar8;
    auVar49._8_4_ = fVar8;
    auVar49._12_4_ = fVar8;
    auVar9 = vfmadd213ps_fma(auVar49,auVar52,auVar43);
    auVar44._4_4_ = fVar34;
    auVar44._0_4_ = fVar34;
    auVar44._8_4_ = fVar34;
    auVar44._12_4_ = fVar34;
    local_98 = vfmadd231ss_fma(auVar38,auVar41,ZEXT416((uint)fVar34));
    local_f8.m_floats = (cbtScalar  [4])vinsertps_avx(auVar10,auVar24,0x28);
    _local_88 = vfmadd213ps_fma(auVar44,auVar53,auVar9);
    local_40.m_floats = (cbtScalar  [4])vinsertps_avx(_local_88,local_98,0x28);
    local_118 = *(undefined8 *)&pcVar4[1].field_0xc;
    uStack_110 = 0;
    uVar27 = *(undefined8 *)((long)&pcVar4[1].m_userPointer + 4);
    uVar31 = 0;
    local_128 = (float)uVar27;
    fStack_124 = (float)((ulong)uVar27 >> 0x20);
    fStack_120 = 0.0;
    fStack_11c = 0.0;
    local_e0 = resultOut;
    local_b8 = this;
    (*pcVar4->_vptr_cbtCollisionShape[0xc])(pcVar4);
    local_d8 = (float)uVar27;
    uStack_d4 = (undefined4)((ulong)uVar27 >> 0x20);
    uStack_d0 = uVar31;
    (*pcVar4->_vptr_cbtCollisionShape[0xc])(pcVar4);
    local_c8 = uVar27;
    uStack_c0 = uVar31;
    (*pcVar4->_vptr_cbtCollisionShape[0xc])(pcVar4);
    auVar38._4_4_ = uStack_d4;
    auVar38._0_4_ = local_d8;
    auVar38._8_8_ = uStack_d0;
    auVar10._4_4_ = fStack_124;
    auVar10._0_4_ = local_128;
    auVar10._8_4_ = fStack_120;
    auVar10._12_4_ = fStack_11c;
    auVar9 = vinsertps_avx(auVar38,ZEXT416((uint)(float)local_c8),0x10);
    auVar24._0_4_ = auVar9._0_4_ + (float)local_118;
    auVar24._4_4_ = auVar9._4_4_ + local_118._4_4_;
    auVar24._8_4_ = auVar9._8_4_ + (float)uStack_110;
    auVar24._12_4_ = auVar9._12_4_ + uStack_110._4_4_;
    auVar9 = vinsertps_avx(ZEXT416((uint)(local_128 + (float)uVar27)),auVar10,0x5c);
    local_50.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar24,auVar9);
    fVar25 = *(float *)&pcVar3[1].field_0xc;
    local_118._0_4_ = fVar25;
    (*pcVar3->_vptr_cbtCollisionShape[0xc])(pcVar3);
    local_128 = fVar25;
    (*pcVar3->_vptr_cbtCollisionShape[0xc])(pcVar3);
    (*pcVar3->_vptr_cbtCollisionShape[0xc])(pcVar3);
    local_118 = CONCAT44(local_118._4_4_,local_128 + (float)local_118);
    uVar27 = *(undefined8 *)&pcVar3[1].field_0xc;
    local_128 = (float)uVar27;
    fStack_124 = (float)((ulong)uVar27 >> 0x20);
    fStack_120 = 0.0;
    fStack_11c = 0.0;
    (*pcVar3->_vptr_cbtCollisionShape[0xc])(pcVar3);
    fVar25 = (float)uVar27;
    (*pcVar3->_vptr_cbtCollisionShape[0xc])(pcVar3);
    local_d8 = fVar25;
    (*pcVar3->_vptr_cbtCollisionShape[0xc])(pcVar3);
    auVar9._4_4_ = fStack_124;
    auVar9._0_4_ = local_128;
    auVar9._8_4_ = fStack_120;
    auVar9._12_4_ = fStack_11c;
    auVar9 = vmovshdup_avx(auVar9);
    local_e8 = 0;
    local_148 = (ulong)local_148._4_4_ << 0x20;
    local_d8 = auVar9._0_4_ + local_d8;
    do {
      auVar35._8_4_ = 0x7fffffff;
      auVar35._0_8_ = 0x7fffffff7fffffff;
      auVar35._12_4_ = 0x7fffffff;
      local_108.m_floats[0] = 0.0;
      local_108.m_floats[1] = 0.0;
      local_108.m_floats[2] = 0.0;
      local_108.m_floats[3] = 0.0;
      fVar25 = local_f8.m_floats[local_e8];
      local_108.m_floats[local_e8] = 1.0;
      cVar11.m_floats = local_f8.m_floats;
      auVar9 = vandps_avx(ZEXT416((uint)(fVar25 + -1.0)),auVar35);
      if ((1e-05 <= auVar9._0_4_) &&
         (auVar9 = vandps_avx(ZEXT416((uint)(fVar25 + 1.0)),auVar35), 1e-05 <= auVar9._0_4_)) {
        auVar36._8_8_ = 0;
        auVar36._0_4_ = local_f8.m_floats[0];
        auVar36._4_4_ = local_f8.m_floats[1];
        auVar45._8_8_ = 0;
        auVar45._0_4_ = local_108.m_floats[0];
        auVar45._4_4_ = local_108.m_floats[1];
        local_f8.m_floats[2] = cVar11.m_floats[2];
        auVar38 = vmovshdup_avx(auVar36);
        auVar9 = vmovshdup_avx(auVar45);
        auVar41 = vfmsub213ss_fma(auVar9,ZEXT416((uint)local_f8.m_floats[2]),
                                  ZEXT416((uint)(local_108.m_floats[2] * auVar38._0_4_)));
        auVar9 = vinsertps_avx(ZEXT416((uint)local_f8.m_floats[2]),auVar36,0x1c);
        auVar28._0_4_ = auVar9._0_4_ * local_108.m_floats[0];
        auVar28._4_4_ = auVar9._4_4_ * local_108.m_floats[1];
        auVar28._8_4_ = auVar9._8_4_ * 0.0;
        auVar28._12_4_ = auVar9._12_4_ * 0.0;
        auVar10 = vinsertps_avx(ZEXT416((uint)local_108.m_floats[2]),auVar45,0x1c);
        auVar10 = vfmsub213ps_fma(auVar10,auVar36,auVar28);
        auVar24 = vpermt2ps_avx512vl(auVar10,_DAT_009d86b0,auVar41);
        auVar29._0_4_ = cVar11.m_floats[1] * auVar24._0_4_;
        auVar29._4_4_ = local_f8.m_floats[2] * auVar24._4_4_;
        auVar29._8_4_ = auVar24._8_4_ * 0.0;
        auVar29._12_4_ = auVar24._12_4_ * 0.0;
        auVar24 = vfmsub231ps_fma(auVar29,auVar10,auVar9);
        auVar10 = vfmsub231ss_fma(ZEXT416((uint)(cVar11.m_floats[0] * auVar10._0_4_)),auVar38,
                                  auVar41);
        fVar25 = auVar24._0_4_;
        auVar37._0_4_ = fVar25 * fVar25;
        fVar1 = auVar24._4_4_;
        auVar37._4_4_ = fVar1 * fVar1;
        fVar7 = auVar24._8_4_;
        auVar37._8_4_ = fVar7 * fVar7;
        fVar8 = auVar24._12_4_;
        auVar37._12_4_ = fVar8 * fVar8;
        auVar9 = vmovshdup_avx(auVar37);
        auVar9 = vfmadd231ss_fma(auVar9,auVar24,auVar24);
        auVar9 = vfmadd231ss_fma(auVar9,auVar10,auVar10);
        auVar9 = vsqrtss_avx(auVar9,auVar9);
        local_f8.m_floats = cVar11.m_floats;
        if (auVar9._0_4_ <= 1e-05) {
          __assert_fail("r.length() > parallel_tol",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/ChCollisionAlgorithmsBullet.cpp"
                        ,0x178,
                        "virtual void chrono::collision::cbtCylshellBoxCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper *, const cbtCollisionObjectWrapper *, const cbtDispatcherInfo &, cbtManifoldResult *)"
                       );
        }
        lVar18 = 0;
        fVar34 = 1.0 / auVar9._0_4_;
        local_128 = fVar25 * fVar34;
        fStack_124 = fVar1 * fVar34;
        fStack_120 = fVar7 * fVar34;
        fStack_11c = fVar8 * fVar34;
        local_c8 = CONCAT44(local_c8._4_4_,auVar10._0_4_ * fVar34);
        bVar14 = true;
        do {
          bVar23 = bVar14;
          fVar25 = (float)local_118 * (float)(&DAT_009d86e8)[lVar18];
          auVar30._0_4_ = fVar25 * local_128 + (float)local_88._0_4_;
          auVar30._4_4_ = fVar25 * fStack_124 + (float)local_88._4_4_;
          auVar30._8_4_ = fVar25 * fStack_120 + fStack_80;
          auVar30._12_4_ = fVar25 * fStack_11c + fStack_7c;
          local_138.m_floats =
               (cbtScalar  [4])
               vinsertps_avx(auVar30,ZEXT416((uint)(fVar25 * (float)local_c8 + (float)local_98._0_4_
                                                   )),0x28);
          bVar14 = bt_utils::IntersectSegmentBox
                             (&local_50,&local_138,&local_f8,local_d8,1e-05,&local_14c,&local_13c);
          if (bVar14) {
            fVar7 = local_f8.m_floats[0];
            fVar8 = local_f8.m_floats[1];
            fVar25 = local_138.m_floats[0];
            auVar39._0_4_ = local_14c * fVar7 + fVar25;
            fVar1 = local_138.m_floats[1];
            auVar39._4_4_ = local_14c * fVar8 + fVar1;
            auVar39._8_4_ = local_14c * 0.0 + 0.0;
            auVar39._12_4_ = local_14c * 0.0 + 0.0;
            local_60.m_floats =
                 (cbtScalar  [4])
                 vinsertps_avx(auVar39,ZEXT416((uint)(local_14c * local_f8.m_floats[2] +
                                                     local_138.m_floats[2])),0x28);
            fVar34 = (local_14c + local_13c) * 0.5;
            auVar46._0_4_ = fVar25 + fVar7 * local_13c;
            auVar46._4_4_ = fVar1 + fVar8 * local_13c;
            auVar46._8_4_ = local_13c * 0.0 + 0.0;
            auVar46._12_4_ = local_13c * 0.0 + 0.0;
            local_70.m_floats =
                 (cbtScalar  [4])
                 vinsertps_avx(auVar46,ZEXT416((uint)(local_138.m_floats[2] +
                                                     local_f8.m_floats[2] * local_13c)),0x28);
            auVar32._0_4_ = fVar25 + fVar7 * fVar34;
            auVar32._4_4_ = fVar1 + fVar8 * fVar34;
            auVar32._8_4_ = fVar34 * 0.0 + 0.0;
            auVar32._12_4_ = fVar34 * 0.0 + 0.0;
            local_a8.m_floats =
                 (cbtScalar  [4])
                 vinsertps_avx(auVar32,ZEXT416((uint)(local_138.m_floats[2] +
                                                     local_f8.m_floats[2] * fVar34)),0x28);
            iVar15 = bt_utils::FindClosestBoxFace(&local_50,&local_a8);
            pcVar2 = local_b0;
            pcVar12 = local_e0;
            iVar16 = addContactPoint(&local_60,iVar15,&local_50,local_b0,local_e0);
            iVar16 = iVar16 + (int)local_148;
            iVar17 = addContactPoint(&local_70,iVar15,&local_50,pcVar2,pcVar12);
            local_148._0_4_ = iVar17;
            iVar15 = addContactPoint(&local_a8,iVar15,&local_50,pcVar2,pcVar12);
            local_148 = CONCAT44(local_148._4_4_,iVar15 + (int)local_148 + iVar16);
          }
          lVar18 = 1;
          bVar14 = false;
        } while (bVar23);
      }
      local_e8 = local_e8 + 1;
    } while (local_e8 != 3);
    if ((int)local_148 < 1) {
      uVar22 = 0;
      do {
        cVar26 = local_50.m_floats[uVar22];
        uVar19 = uVar22 + 1;
        local_148 = (ulong)((int)uVar22 - 1);
        local_98._0_8_ = uVar22;
        local_78 = uVar19;
        local_108.m_floats[0] = 0.0;
        local_108.m_floats[1] = 0.0;
        local_108.m_floats[2] = 0.0;
        local_108.m_floats[3] = 0.0;
        local_108.m_floats[uVar22] = 1.0;
        local_88 = (undefined1  [8])0;
        if (uVar19 != 3) {
          local_88 = (undefined1  [8])(uVar19 & 0xffffffff);
        }
        if (uVar22 == 0) {
          local_148 = 2;
        }
        uVar19 = 0xffffffff;
        local_c8 = CONCAT44(local_c8._4_4_,cVar26);
        do {
          local_128 = (float)(int)uVar19;
          iVar15 = -3;
          local_e8 = uVar19;
          do {
            fVar25 = local_128;
            auVar13 = local_88;
            local_138.m_floats[uVar22] = 0.0;
            fVar1 = local_d8;
            cVar26 = (float)local_118;
            local_138.m_floats[(long)auVar13] = fVar25 * local_50.m_floats[(long)auVar13];
            local_138.m_floats[local_148] = (float)(iVar15 + 2) * local_50.m_floats[local_148];
            bVar14 = bt_utils::IntersectSegmentCylinder
                               (&local_138,&local_108,(float)local_c8,&local_40,&local_f8,fVar1,
                                cVar26,1e-05,&local_14c,&local_13c);
            pcVar2 = local_b0;
            pcVar12 = local_e0;
            if (bVar14) {
              fVar7 = local_108.m_floats[0];
              fVar8 = local_108.m_floats[1];
              fVar25 = local_138.m_floats[0];
              auVar40._0_4_ = local_14c * fVar7 + fVar25;
              fVar1 = local_138.m_floats[1];
              auVar40._4_4_ = local_14c * fVar8 + fVar1;
              auVar40._8_4_ = local_14c * 0.0 + 0.0;
              auVar40._12_4_ = local_14c * 0.0 + 0.0;
              local_60.m_floats =
                   (cbtScalar  [4])
                   vinsertps_avx(auVar40,ZEXT416((uint)(local_14c * local_108.m_floats[2] +
                                                       local_138.m_floats[2])),0x28);
              fVar34 = (local_14c + local_13c) * 0.5;
              auVar47._0_4_ = fVar25 + fVar7 * local_13c;
              auVar47._4_4_ = fVar1 + fVar8 * local_13c;
              auVar47._8_4_ = local_13c * 0.0 + 0.0;
              auVar47._12_4_ = local_13c * 0.0 + 0.0;
              local_70.m_floats =
                   (cbtScalar  [4])
                   vinsertps_avx(auVar47,ZEXT416((uint)(local_138.m_floats[2] +
                                                       local_108.m_floats[2] * local_13c)),0x28);
              auVar33._0_4_ = fVar25 + fVar7 * fVar34;
              auVar33._4_4_ = fVar1 + fVar8 * fVar34;
              auVar33._8_4_ = fVar34 * 0.0 + 0.0;
              auVar33._12_4_ = fVar34 * 0.0 + 0.0;
              local_a8.m_floats =
                   (cbtScalar  [4])
                   vinsertps_avx(auVar33,ZEXT416((uint)(local_138.m_floats[2] +
                                                       local_108.m_floats[2] * fVar34)),0x28);
              cVar26 = local_a8.m_floats[0];
              addContactPoint(&local_60,&local_40,&local_f8,cVar26,(float)local_118,local_b0,
                              local_e0);
              addContactPoint(&local_70,&local_40,&local_f8,cVar26,(float)local_118,pcVar2,pcVar12);
              uVar22 = local_98._0_8_;
              addContactPoint(&local_a8,&local_40,&local_f8,cVar26,(float)local_118,pcVar2,pcVar12);
            }
            iVar15 = iVar15 + 2;
          } while (iVar15 < 0);
          uVar19 = (ulong)((int)local_e8 + 2);
        } while ((int)local_e8 < 0);
        uVar22 = local_78;
      } while (local_78 != 3);
      if (((local_b8->m_ownManifold != false) && (local_b8->m_manifoldPtr->m_cachedPoints != 0)) &&
         (this_00 = local_e0->m_manifoldPtr, this_00->m_cachedPoints != 0)) {
        pcVar5 = local_e0->m_body0Wrap->m_collisionObject;
        pcVar6 = local_e0->m_body1Wrap->m_collisionObject;
        pcVar21 = pcVar6;
        if (this_00->m_body0 == pcVar5) {
          pcVar21 = pcVar5;
          pcVar5 = pcVar6;
        }
        cbtPersistentManifold::refreshContactPoints
                  (this_00,&pcVar21->m_worldTransform,&pcVar5->m_worldTransform);
      }
    }
  }
  return;
}

Assistant:

void cbtCylshellBoxCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0,
                                                        const cbtCollisionObjectWrapper* body1,
                                                        const cbtDispatcherInfo& dispatchInfo,
                                                        cbtManifoldResult* resultOut) {
    (void)dispatchInfo;
    (void)resultOut;
    if (!m_manifoldPtr)
        return;

    const cbtCollisionObjectWrapper* cylObjWrap = m_isSwapped ? body1 : body0;
    const cbtCollisionObjectWrapper* boxObjWrap = m_isSwapped ? body0 : body1;

    resultOut->setPersistentManifold(m_manifoldPtr);

    const cbtCylindricalShellShape* cyl = (cbtCylindricalShellShape*)cylObjWrap->getCollisionShape();
    const cbtBoxShape* box = (cbtBoxShape*)boxObjWrap->getCollisionShape();

    // Express cylinder in the box frame
    const cbtTransform& abs_X_cyl = cylObjWrap->getWorldTransform();
    const cbtTransform& abs_X_box = boxObjWrap->getWorldTransform();
    cbtTransform box_X_cyl = abs_X_box.inverseTimes(abs_X_cyl);

    cbtVector3 a = box_X_cyl.getBasis().getColumn(1);  // cylinder axis (expressed in box frame)
    cbtVector3 c = box_X_cyl.getOrigin();              // cylinder center (expressed in box frame)

    // Box dimensions
    cbtVector3 hdims = box->getHalfExtentsWithMargin();

    // Cylinder dimensions
    cbtScalar radius = cyl->getRadius();    // cylinder radius
    cbtScalar hlen = cyl->getHalfLength();  // cylinder half-length

    const cbtScalar parallel_tol = cbtScalar(1e-5);  // tolearance for parallelism tests

    int num_contacts = 0;

    // - Loop over each direction of the box frame (i.e., each of the 3 face normals).
    // - For each direction, consider two segments on the cylindrical surface that are on a plane defined by the axis
    //   and the face normal. (Note that, in principle, we could only consider the segment "closest" to the box, but
    //   that is not trivial to define in all configurations). All segments are parameterized by t in [-H,H].
    // - For each segment, if the segment intersects the box, consider 3 candidate contact points: the 2 intersection
    //   points and their midpoint. A contact is added if the segment point is inside the box.
    //   Furthermore, the corresponding box point is located on the box face that is closest to the intersection
    //   midpoint candidate.
    for (int idir = 0; idir < 3; idir++) {
        // current box direction
        cbtVector3 ndir(0, 0, 0);
        ndir[idir] = 1;

        // If the axis is parallel to the current direction, no contact.
        if (std::abs(a[idir] - 1) < parallel_tol || std::abs(a[idir] + 1) < parallel_tol)
            continue;

        // Direction perpendicular to cylinder axis (in direction opposite to ndir)
        cbtVector3 v = ndir.cross(a);
        cbtVector3 r = v.cross(a);
        assert(r.length() > parallel_tol);
        r.normalize();

        // Consider segments in both "negative" and "positive" r direction
        cbtScalar dir[2] = {-1, 1};
        for (int jdir = 0; jdir < 2; jdir++) {
            // Calculate current segment center
            cbtVector3 cs = c + dir[jdir] * radius * r;
            // Check for intersection with box
            cbtScalar tMin, tMax;
            if (bt_utils::IntersectSegmentBox(hdims, cs, a, hlen, parallel_tol, tMin, tMax)) {
                // Consider the intersection points and their midpoint as candidates
                cbtVector3 pMin = cs + a * tMin;
                cbtVector3 pMax = cs + a * tMax;
                cbtVector3 pMid = cs + a * ((tMin + tMax) / 2);

                // Pick box face that is closest to midpoint
                int iface = bt_utils::FindClosestBoxFace(hdims, pMid);

                // Add a contact for any of the candidate points that is inside the box
                num_contacts += addContactPoint(pMin, iface, hdims, abs_X_box, resultOut);  // 1st segment end
                num_contacts += addContactPoint(pMax, iface, hdims, abs_X_box, resultOut);  // 2nd segment end
                num_contacts += addContactPoint(pMid, iface, hdims, abs_X_box, resultOut);  // intersection midpoint
            }
        }
    }

    // If a box face supports the cylinder, do not check box edges.
    if (num_contacts > 0)
        return;

    // - Loop over each direction of the box frame.
    // - For each direction, check intersection with the cylinder for all 4 edges parallel to that direction.
    // - If an edge intersects the cylinder, consider 3 candidate contact points: the 2 intersection points
    //   and their midpoint.
    for (int idir = 0; idir < 3; idir++) {
        // current box edge direction and halflength
        cbtVector3 eD(0, 0, 0);
        eD[idir] = 1;
        cbtScalar eH = hdims[idir];
        // The other two box directions
        int jdir = (idir + 1) % 3;
        int kdir = (idir + 2) % 3;
        for (int j = -1; j <= +1; j += 2) {
            for (int k = -1; k <= +1; k += 2) {
                cbtVector3 eC;
                eC[idir] = 0;
                eC[jdir] = j * hdims[jdir];
                eC[kdir] = k * hdims[kdir];
                // Check for edge intersection with cylinder
                cbtScalar tMin, tMax;
                if (bt_utils::IntersectSegmentCylinder(eC, eD, eH, c, a, hlen, radius, parallel_tol, tMin, tMax)) {
                    // Consider the intersection points and their midpoint as candidates
                    cbtVector3 pMin = eC + eD * tMin;
                    cbtVector3 pMax = eC + eD * tMax;
                    cbtVector3 pMid = eC + eD * ((tMin + tMax) / 2);

                    // Add a contact for any of the candidate points that is inside the cylinder
                    num_contacts += addContactPoint(pMin, c, a, hlen, radius, abs_X_box, resultOut);
                    num_contacts += addContactPoint(pMax, c, a, hlen, radius, abs_X_box, resultOut);
                    num_contacts += addContactPoint(pMid, c, a, hlen, radius, abs_X_box, resultOut);
                }
            }
        }
    }

    ////std::cout << num_contacts << std::endl;

    if (m_ownManifold && m_manifoldPtr->getNumContacts()) {
        resultOut->refreshContactPoints();
    }
}